

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int xerror_handler(Display *d,XErrorEvent *e)

{
  undefined1 local_118 [8];
  char buf2 [128];
  char buf1 [128];
  XErrorEvent *e_local;
  Display *d_local;
  
  sprintf(buf2 + 0x78,"XRequest.%d",(ulong)e->request_code);
  XGetErrorDatabaseText(d,"",buf2 + 0x78,buf2 + 0x78,local_118,0x80);
  XGetErrorText(d,e->error_code,buf2 + 0x78,0x80);
  (*Fl::warning)("%s: %s 0x%lx",local_118,buf2 + 0x78,e->resourceid);
  return 0;
}

Assistant:

static int xerror_handler(Display* d, XErrorEvent* e) {
    char buf1[128], buf2[128];
    sprintf(buf1, "XRequest.%d", e->request_code);
    XGetErrorDatabaseText(d,"",buf1,buf1,buf2,128);
    XGetErrorText(d, e->error_code, buf1, 128);
    Fl::warning("%s: %s 0x%lx", buf2, buf1, e->resourceid);
    return 0;
  }